

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O1

void av1_remove_primary_compressor(AV1_PRIMARY *ppi)

{
  uint8_t **ppuVar1;
  uint8_t uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  EncWorkerData *pEVar6;
  ThreadData_conflict *td;
  int num_planes;
  int y;
  long lVar7;
  long lVar8;
  uint32_t *(*papuVar9) [2];
  long lVar10;
  YV12_BUFFER_CONFIG *ybf;
  bool bVar11;
  
  if (ppi != (AV1_PRIMARY *)0x0) {
    av1_tf_info_free(&ppi->tf_info);
    lVar10 = 0xb57;
    do {
      aom_free(ppi->parallel_cpi[lVar10]);
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0xb77);
    av1_lookahead_destroy(ppi->lookahead);
    aom_free(ppi->tpl_sb_rdmult_scaling_factors);
    ppi->tpl_sb_rdmult_scaling_factors = (double *)0x0;
    aom_free((ppi->tpl_data).txfm_stats_list);
    ybf = (ppi->tpl_data).tpl_rec_pool;
    lVar10 = 0x1f42;
    do {
      aom_free(ppi->parallel_cpi[lVar10]);
      aom_free_frame_buffer(ybf);
      ppi->parallel_cpi[lVar10] = (AV1_COMP *)0x0;
      ybf = ybf + 1;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x1f72);
    av1_tpl_dealloc(&(ppi->tpl_data).tpl_mt_sync);
    av1_terminate_workers(ppi);
    iVar3 = (ppi->p_mt_info).num_workers;
    if (1 < iVar3) {
      num_planes = (uint)((ppi->seq_params).monochrome == '\0') * 2 + 1;
      iVar4 = (ppi->p_mt_info).num_mod_workers[2];
      if (iVar3 <= iVar4) {
        iVar4 = iVar3;
      }
      iVar5 = (ppi->p_mt_info).num_mod_workers[1];
      if (iVar5 < iVar3) {
        iVar3 = iVar5;
      }
      uVar2 = (ppi->seq_params).use_highbitdepth;
      lVar10 = 1;
      do {
        pEVar6 = (ppi->p_mt_info).tile_thr_data;
        td = pEVar6[lVar10].original_td;
        pEVar6[lVar10].td = td;
        if (td != (ThreadData_conflict *)0x0) {
          aom_free(td->tctx);
          aom_free(td->palette_buffer);
          aom_free(td->tmp_conv_dst);
          aom_free((td->comp_rd_buffer).pred0);
          aom_free((td->comp_rd_buffer).pred1);
          aom_free((td->comp_rd_buffer).residual1);
          aom_free((td->comp_rd_buffer).diff10);
          aom_free((td->comp_rd_buffer).tmp_best_mask_buf);
          (td->comp_rd_buffer).residual1 = (int16_t *)0x0;
          (td->comp_rd_buffer).diff10 = (int16_t *)0x0;
          (td->comp_rd_buffer).pred0 = (uint8_t *)0x0;
          (td->comp_rd_buffer).pred1 = (uint8_t *)0x0;
          (td->comp_rd_buffer).tmp_best_mask_buf = (uint8_t *)0x0;
          lVar8 = 0x4ba7;
          do {
            aom_free((&(td->mb).plane[0].src_diff)[lVar8]);
            lVar8 = lVar8 + 1;
          } while (lVar8 == 0x4ba8);
          aom_free(td->pixel_gradient_info);
          aom_free(td->src_var_info_of_4x4_sub_blocks);
          aom_free((td->obmc_buffer).mask);
          aom_free((td->obmc_buffer).above_pred);
          aom_free((td->obmc_buffer).left_pred);
          aom_free((td->obmc_buffer).wsrc);
          (td->obmc_buffer).above_pred = (uint8_t *)0x0;
          (td->obmc_buffer).left_pred = (uint8_t *)0x0;
          (td->obmc_buffer).wsrc = (int32_t *)0x0;
          (td->obmc_buffer).mask = (int32_t *)0x0;
          aom_free(td->vt64x64);
          papuVar9 = td->hash_value_buffer;
          lVar8 = 0;
          do {
            lVar7 = 0;
            do {
              aom_free((*papuVar9)[lVar7]);
              (*papuVar9)[lVar7] = (uint32_t *)0x0;
              lVar7 = lVar7 + 1;
            } while (lVar7 == 1);
            papuVar9 = papuVar9 + 1;
            bVar11 = lVar8 == 0;
            lVar8 = lVar8 + 1;
          } while (bVar11);
          aom_free(td->mv_costs_alloc);
          td->mv_costs_alloc = (MvCosts *)0x0;
          aom_free(td->dv_costs_alloc);
          td->dv_costs_alloc = (IntraBCMVCosts *)0x0;
          aom_free(td->counts);
          av1_free_pmc(td->firstpass_ctx,num_planes);
          td->firstpass_ctx = (PICK_MODE_CONTEXT *)0x0;
          av1_free_shared_coeff_buffer(&td->shared_coeff_buf);
          av1_free_sms_tree(td);
          if (lVar10 < iVar3) {
            if (uVar2 != '\0') {
              ppuVar1 = &(td->tf_data).pred;
              *ppuVar1 = (uint8_t *)((long)*ppuVar1 << 1);
            }
            aom_free((td->tf_data).tmp_mbmi);
            (td->tf_data).tmp_mbmi = (MB_MODE_INFO *)0x0;
            aom_free((td->tf_data).accum);
            (td->tf_data).accum = (uint32_t *)0x0;
            aom_free((td->tf_data).count);
            (td->tf_data).count = (uint16_t *)0x0;
            aom_free((td->tf_data).pred);
            (td->tf_data).pred = (uint8_t *)0x0;
          }
          if (lVar10 < iVar4) {
            aom_free((td->tpl_tmp_buffers).predictor8);
            (td->tpl_tmp_buffers).predictor8 = (uint8_t *)0x0;
            aom_free((td->tpl_tmp_buffers).src_diff);
            (td->tpl_tmp_buffers).src_diff = (int16_t *)0x0;
            aom_free((td->tpl_tmp_buffers).coeff);
            (td->tpl_tmp_buffers).coeff = (tran_low_t *)0x0;
            aom_free((td->tpl_tmp_buffers).qcoeff);
            (td->tpl_tmp_buffers).qcoeff = (tran_low_t *)0x0;
            aom_free((td->tpl_tmp_buffers).dqcoeff);
            (td->tpl_tmp_buffers).dqcoeff = (tran_low_t *)0x0;
          }
          aom_free((td->gm_data).segment_map);
          (td->gm_data).segment_map = (uint8_t *)0x0;
          aom_free((td->gm_data).motion_models[0].inliers);
          (td->gm_data).motion_models[0].inliers = (int *)0x0;
          aom_free((td->mb).txfm_search_info.mb_rd_record);
          (td->mb).txfm_search_info.mb_rd_record = (MB_RD_RECORD *)0x0;
          aom_free((td->mb).inter_modes_info);
          (td->mb).inter_modes_info = (inter_modes_info *)0x0;
          av1_dealloc_src_diff_buf(&td->mb,num_planes);
          aom_free((td->mb).e_mbd.seg_mask);
          (td->mb).e_mbd.seg_mask = (uint8_t *)0x0;
          aom_free((td->mb).winner_mode_stats);
          (td->mb).winner_mode_stats = (WinnerModeStats *)0x0;
          aom_free((td->mb).dqcoeff_buf);
          (td->mb).dqcoeff_buf = (tran_low_t *)0x0;
          aom_free((td->mb).sb_stats_cache);
          (td->mb).sb_stats_cache = (SB_FIRST_PASS_STATS *)0x0;
          aom_free((td->mb).sb_fp_stats);
          (td->mb).sb_fp_stats = (SB_FIRST_PASS_STATS *)0x0;
          av1_free_pc_tree_recursive(td->pc_root,num_planes,0,0,'\0');
          td->pc_root = (PC_TREE *)0x0;
          av1_dealloc_mb_wiener_var_pred_buf(td);
          aom_free(td);
          pEVar6[lVar10].td = (ThreadData_conflict *)0x0;
          pEVar6[lVar10].original_td = (ThreadData_conflict *)0x0;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < (ppi->p_mt_info).num_workers);
    }
    aom_free((ppi->p_mt_info).tile_thr_data);
    (ppi->p_mt_info).tile_thr_data = (EncWorkerData *)0x0;
    aom_free((ppi->p_mt_info).workers);
    (ppi->p_mt_info).workers = (AVxWorker *)0x0;
    (ppi->p_mt_info).num_workers = 0;
    aom_free(ppi);
    return;
  }
  return;
}

Assistant:

void av1_remove_primary_compressor(AV1_PRIMARY *ppi) {
  if (!ppi) return;
#if !CONFIG_REALTIME_ONLY
  av1_tf_info_free(&ppi->tf_info);
#endif  // !CONFIG_REALTIME_ONLY

  for (int i = 0; i < MAX_NUM_OPERATING_POINTS; ++i) {
    aom_free(ppi->level_params.level_info[i]);
  }
  av1_lookahead_destroy(ppi->lookahead);

  aom_free(ppi->tpl_sb_rdmult_scaling_factors);
  ppi->tpl_sb_rdmult_scaling_factors = NULL;

  TplParams *const tpl_data = &ppi->tpl_data;
  aom_free(tpl_data->txfm_stats_list);

  for (int frame = 0; frame < MAX_LAG_BUFFERS; ++frame) {
    aom_free(tpl_data->tpl_stats_pool[frame]);
    aom_free_frame_buffer(&tpl_data->tpl_rec_pool[frame]);
    tpl_data->tpl_stats_pool[frame] = NULL;
  }

#if !CONFIG_REALTIME_ONLY
  av1_tpl_dealloc(&tpl_data->tpl_mt_sync);
#endif

  av1_terminate_workers(ppi);
  free_thread_data(ppi);

  aom_free(ppi->p_mt_info.tile_thr_data);
  ppi->p_mt_info.tile_thr_data = NULL;
  aom_free(ppi->p_mt_info.workers);
  ppi->p_mt_info.workers = NULL;
  ppi->p_mt_info.num_workers = 0;

  aom_free(ppi);
}